

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
RandomGen::VonNeumann
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RandomGen *this,
          double xMin,double xMax,double yMin,double yMax,double xTest,double yTest,double fValue)

{
  double dVar1;
  reference pvVar2;
  RandomGen *pRVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  allocator<double> local_52;
  undefined1 local_51;
  double local_50;
  double fValue_local;
  double yTest_local;
  double xTest_local;
  double yMax_local;
  double yMin_local;
  double xMax_local;
  double xMin_local;
  RandomGen *this_local;
  vector<double,_std::allocator<double>_> *xyTry;
  
  local_51 = 0;
  local_50 = fValue;
  fValue_local = yTest;
  yTest_local = xTest;
  xTest_local = yMax;
  yMax_local = yMin;
  yMin_local = xMax;
  xMax_local = xMin;
  xMin_local = (double)this;
  this_local = (RandomGen *)__return_storage_ptr__;
  std::allocator<double>::allocator(&local_52);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,3,&local_52);
  std::allocator<double>::~allocator(&local_52);
  dVar1 = yTest_local;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  dVar6 = fValue_local;
  *pvVar2 = dVar1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  *pvVar2 = dVar6;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  dVar6 = xMax_local;
  if (*pvVar2 <= local_50) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
    *pvVar2 = 0.0;
  }
  else {
    dVar4 = yMin_local - xMax_local;
    pRVar3 = rndm();
    dVar5 = rand_uniform(pRVar3);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
    dVar1 = yMax_local;
    *pvVar2 = dVar4 * dVar5 + dVar6;
    dVar6 = xTest_local - yMax_local;
    pRVar3 = rndm();
    dVar4 = rand_uniform(pRVar3);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
    *pvVar2 = dVar6 * dVar4 + dVar1;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
    *pvVar2 = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> RandomGen::VonNeumann(double xMin, double xMax, double yMin,
                                     double yMax, double xTest, double yTest,
                                     double fValue) {
  vector<double> xyTry(3);

  xyTry[0] = xTest;
  xyTry[1] = yTest;

  if (xyTry[1] > fValue) {
    xyTry[0] = xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform();
    xyTry[1] = yMin + (yMax - yMin) * RandomGen::rndm()->rand_uniform();
    xyTry[2] = 1.;
  } else
    xyTry[2] = 0.;

  return xyTry;  // doing a vector means you can return 2 values at the same
                 // time
}